

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCADeserialization.h
# Opt level: O1

void __thiscall
Js::DeserializationCloner<Js::StreamReader>::ReadTypedArray<short,false>
          (DeserializationCloner<Js::StreamReader> *this,Dst *dst)

{
  bool bVar1;
  scaposition_t src;
  Engine *this_00;
  ArrayBufferBase *arrayBuffer_00;
  Var pvVar2;
  uint32 local_38;
  uint32 local_34;
  uint32 byteOffset;
  uint32 length;
  Dst arrayBuffer;
  
  this_00 = ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
            ::GetEngine(&this->
                         super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                       );
  src = StreamReader::GetPosition(this->m_reader);
  SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_>::Clone
            (this_00,src,(void **)&byteOffset);
  if ((_byteOffset != (RecyclableObject *)0x0) && ((ulong)_byteOffset >> 0x30 == 0)) {
    bVar1 = VarIsImpl<Js::ArrayBufferBase>(_byteOffset);
    if (bVar1) {
      StreamReader::Read<unsigned_int>(this->m_reader,&local_38);
      StreamReader::Read<unsigned_int>(this->m_reader,&local_34);
      arrayBuffer_00 = VarTo<Js::ArrayBufferBase>(_byteOffset);
      pvVar2 = TypedArray<short,_false,_false>::Create
                         (arrayBuffer_00,local_38,local_34,
                          (((this->
                            super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                            ).super_ScriptContextHolder.m_scriptContext)->super_ScriptContextBase).
                          javascriptLibrary);
      *dst = pvVar2;
      return;
    }
  }
  ScriptContextHolder::ThrowSCADataCorrupt((ScriptContextHolder *)this);
}

Assistant:

void ReadTypedArray(Dst* dst) const
        {
            typedef TypedArrayTrace<T,clamped> trace_type;

            Dst arrayBuffer;
            this->GetEngine()->Clone(m_reader->GetPosition(), &arrayBuffer);
            if (!arrayBuffer || !VarIs<ArrayBufferBase>(arrayBuffer))
            {
                this->ThrowSCADataCorrupt();
            }

            uint32 byteOffset, length;
            Read(&byteOffset);
            Read(&length);
            *dst = trace_type::CreateTypedArray(
                VarTo<ArrayBufferBase>(arrayBuffer), byteOffset, length, this->GetScriptContext());
        }